

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall slang::ast::TypeArgFormatter::startMessage(TypeArgFormatter *this,Diagnostic *diag)

{
  group_type_pointer pgVar1;
  char *pcVar2;
  undefined4 uVar3;
  Type *pTVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  group_type_pointer pgVar8;
  value_type_pointer ppVar9;
  bool bVar10;
  uint uVar11;
  Type **ppTVar12;
  uint64_t hash;
  value_type *elements;
  ulong uVar13;
  basic_string_view<char,_std::char_traits<char>_> *pbVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  pointer pvVar20;
  pointer pvVar21;
  uchar uVar22;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_96UL,_16UL>_>
  typeNames;
  try_emplace_args_t local_181;
  Type *local_180;
  table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
  *local_178;
  pointer local_170;
  TypeArgFormatter *local_168;
  basic_string_view<char,_std::char_traits<char>_> *local_160;
  ulong local_158;
  uint64_t local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  locator local_130;
  undefined1 local_118 [16];
  uchar local_108;
  uchar uStack_107;
  uchar uStack_106;
  byte bStack_105;
  uchar uStack_104;
  uchar uStack_103;
  uchar uStack_102;
  byte bStack_101;
  uchar uStack_100;
  uchar uStack_ff;
  uchar uStack_fe;
  byte bStack_fd;
  uchar uStack_fc;
  uchar uStack_fb;
  uchar uStack_fa;
  byte bStack_f9;
  uchar local_f8;
  uchar uStack_f7;
  uchar uStack_f6;
  byte bStack_f5;
  uchar uStack_f4;
  uchar uStack_f3;
  uchar uStack_f2;
  byte bStack_f1;
  uchar uStack_f0;
  uchar uStack_ef;
  uchar uStack_ee;
  byte bStack_ed;
  uchar uStack_ec;
  uchar uStack_eb;
  uchar uStack_ea;
  byte bStack_e9;
  char local_e8;
  char cStack_e7;
  char cStack_e6;
  char cStack_e5;
  char cStack_e4;
  char cStack_e3;
  char cStack_e2;
  char cStack_e1;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  char cStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  byte bStack_d9;
  undefined1 local_d8 [104];
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_96UL,_16UL>_>
  local_70;
  
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::clear((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
           *)&this->seenTypes);
  local_178 = (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
               *)&this->typesToDisambiguate;
  local_168 = this;
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::clear((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
           *)local_178);
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_96UL,_16UL>_>
  ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_96UL,_16UL>_>
              *)local_d8);
  pvVar21 = (diag->args).
            super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar20 = (diag->args).
            super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_170 = pvVar20;
LAB_003f57bc:
  if (pvVar21 == pvVar20) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_96UL,_16UL>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_96UL,_16UL>_>
                   *)(local_d8 + 0x68));
    return;
  }
  if ((((pvVar21 != (pointer)0x0) &&
       ((pvVar21->
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        ).
        super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        .
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        .
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        .
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        .
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
        ._M_index == '\x05')) &&
      (ppTVar12 = std::any_cast<slang::ast::Type_const*>
                            ((any *)((long)&(pvVar21->
                                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                            ).
                                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                            .
                                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                            .
                                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                            .
                                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                            .
                                            super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                            ._M_u + 8)), ppTVar12 != (Type **)0x0)) &&
     (pTVar4 = *ppTVar12, (pTVar4->super_Symbol).kind == TypeAlias)) {
    pbVar14 = &(pTVar4->super_Symbol).name;
    local_180 = pTVar4;
    hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      (local_d8 + 0x68),pbVar14);
    uVar13 = hash >> ((byte)local_70.arrays.groups_size_index & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    auVar27._4_4_ = uVar3;
    auVar27._0_4_ = uVar3;
    auVar27._8_4_ = uVar3;
    auVar27._12_4_ = uVar3;
    uVar18 = (ulong)((uint)hash & 7);
    uVar15 = 0;
    uVar17 = uVar13;
    do {
      ppVar9 = local_70.arrays.elements_;
      pgVar8 = local_70.arrays.groups_;
      pcVar2 = (char *)((long)local_70.arrays.groups_ + uVar17 * 0x10);
      local_e8 = *pcVar2;
      cStack_e7 = pcVar2[1];
      cStack_e6 = pcVar2[2];
      cStack_e5 = pcVar2[3];
      cStack_e4 = pcVar2[4];
      cStack_e3 = pcVar2[5];
      cStack_e2 = pcVar2[6];
      cStack_e1 = pcVar2[7];
      cStack_e0 = pcVar2[8];
      cStack_df = pcVar2[9];
      cStack_de = pcVar2[10];
      cStack_dd = pcVar2[0xb];
      cStack_dc = pcVar2[0xc];
      cStack_db = pcVar2[0xd];
      cStack_da = pcVar2[0xe];
      bVar26 = pcVar2[0xf];
      auVar23[0] = -(local_e8 == auVar27[0]);
      auVar23[1] = -(cStack_e7 == auVar27[1]);
      auVar23[2] = -(cStack_e6 == auVar27[2]);
      auVar23[3] = -(cStack_e5 == auVar27[3]);
      auVar23[4] = -(cStack_e4 == auVar27[4]);
      auVar23[5] = -(cStack_e3 == auVar27[5]);
      auVar23[6] = -(cStack_e2 == auVar27[6]);
      auVar23[7] = -(cStack_e1 == auVar27[7]);
      auVar23[8] = -(cStack_e0 == auVar27[8]);
      auVar23[9] = -(cStack_df == auVar27[9]);
      auVar23[10] = -(cStack_de == auVar27[10]);
      auVar23[0xb] = -(cStack_dd == auVar27[0xb]);
      auVar23[0xc] = -(cStack_dc == auVar27[0xc]);
      auVar23[0xd] = -(cStack_db == auVar27[0xd]);
      auVar23[0xe] = -(cStack_da == auVar27[0xe]);
      auVar23[0xf] = -(bVar26 == auVar27[0xf]);
      uVar11 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
      uVar19 = uVar17;
      bStack_d9 = bVar26;
      if (uVar11 != 0) {
        do {
          local_118 = auVar27;
          local_138 = uVar18;
          local_140 = uVar15;
          local_148 = uVar19;
          local_150 = hash;
          local_158 = uVar13;
          local_160 = pbVar14;
          uVar5 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          pbVar14 = (basic_string_view<char,_std::char_traits<char>_> *)
                    ((long)ppVar9 + (uVar17 * 0xf + (ulong)uVar5) * 0x18);
          bVar10 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              (local_d8 + 0x68),local_160,pbVar14);
          if (bVar10) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = pTVar4;
            uVar18 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                     SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
            uVar15 = uVar18 >> ((byte)(local_168->typesToDisambiguate).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                                      .arrays.groups_size_index & 0x3f);
            uVar3 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[uVar18 & 0xff];
            uVar17 = (local_168->typesToDisambiguate).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                     .arrays.groups_size_mask;
            uVar19 = 0;
            uVar13 = uVar15;
            goto LAB_003f59eb;
          }
          uVar11 = uVar11 - 1 & uVar11;
          pbVar14 = local_160;
          uVar13 = local_158;
          hash = local_150;
          uVar19 = local_148;
          uVar15 = local_140;
          uVar18 = local_138;
          auVar27 = local_118;
        } while (uVar11 != 0);
        bVar26 = *(byte *)((long)pgVar8 + uVar17 * 0x10 + 0xf);
        uVar17 = local_148;
      }
      pvVar20 = local_170;
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar18] & bVar26) == 0) break;
      lVar16 = uVar17 + uVar15;
      uVar15 = uVar15 + 1;
      uVar17 = lVar16 + 1U & local_70.arrays.groups_size_mask;
    } while (uVar15 <= local_70.arrays.groups_size_mask);
    if (local_70.size_ctrl.size < local_70.size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Type_const*>,96ul,16ul>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Type_const*>
                (&local_130,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Type_const*>,96ul,16ul>>
                  *)(local_d8 + 0x68),uVar13,hash,&local_181,pbVar14,&local_180);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Type_const*>,96ul,16ul>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Type_const*>
                (&local_130,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Type_const*>,96ul,16ul>>
                  *)(local_d8 + 0x68),hash,&local_181,pbVar14,&local_180);
    }
  }
  goto LAB_003f5b82;
  while( true ) {
    lVar16 = uVar13 + uVar19;
    uVar19 = uVar19 + 1;
    uVar13 = lVar16 + 1U & uVar17;
    if (uVar17 < uVar19) break;
LAB_003f59eb:
    pgVar1 = (local_168->typesToDisambiguate).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
             .arrays.groups_ + uVar13;
    local_f8 = pgVar1->m[0].n;
    uStack_f7 = pgVar1->m[1].n;
    uStack_f6 = pgVar1->m[2].n;
    bStack_f5 = pgVar1->m[3].n;
    uStack_f4 = pgVar1->m[4].n;
    uStack_f3 = pgVar1->m[5].n;
    uStack_f2 = pgVar1->m[6].n;
    bStack_f1 = pgVar1->m[7].n;
    uStack_f0 = pgVar1->m[8].n;
    uStack_ef = pgVar1->m[9].n;
    uStack_ee = pgVar1->m[10].n;
    bStack_ed = pgVar1->m[0xb].n;
    uStack_ec = pgVar1->m[0xc].n;
    uStack_eb = pgVar1->m[0xd].n;
    uStack_ea = pgVar1->m[0xe].n;
    bStack_e9 = pgVar1->m[0xf].n;
    uVar22 = (uchar)uVar3;
    auVar28[0] = -(local_f8 == uVar22);
    uVar24 = (uchar)((uint)uVar3 >> 8);
    auVar28[1] = -(uStack_f7 == uVar24);
    uVar25 = (uchar)((uint)uVar3 >> 0x10);
    auVar28[2] = -(uStack_f6 == uVar25);
    bVar26 = (byte)((uint)uVar3 >> 0x18);
    auVar28[3] = -(bStack_f5 == bVar26);
    auVar28[4] = -(uStack_f4 == uVar22);
    auVar28[5] = -(uStack_f3 == uVar24);
    auVar28[6] = -(uStack_f2 == uVar25);
    auVar28[7] = -(bStack_f1 == bVar26);
    auVar28[8] = -(uStack_f0 == uVar22);
    auVar28[9] = -(uStack_ef == uVar24);
    auVar28[10] = -(uStack_ee == uVar25);
    auVar28[0xb] = -(bStack_ed == bVar26);
    auVar28[0xc] = -(uStack_ec == uVar22);
    auVar28[0xd] = -(uStack_eb == uVar24);
    auVar28[0xe] = -(uStack_ea == uVar25);
    auVar28[0xf] = -(bStack_e9 == bVar26);
    for (uVar11 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe); uVar11 != 0;
        uVar11 = uVar11 - 1 & uVar11) {
      uVar5 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      local_180 = pTVar4;
      if (pTVar4 == (local_168->typesToDisambiguate).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                    .arrays.elements_[uVar13 * 0xf + (ulong)uVar5]) goto LAB_003f5a87;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bStack_e9) == 0) break;
  }
  if ((local_168->typesToDisambiguate).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
      .size_ctrl.size <
      (local_168->typesToDisambiguate).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
      .size_ctrl.ml) {
    local_180 = pTVar4;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
    ::unchecked_emplace_at<slang::ast::Type_const*>
              ((locator *)&local_130,local_178,uVar15,uVar18,&local_180);
  }
  else {
    local_180 = pTVar4;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
    ::unchecked_emplace_with_rehash<slang::ast::Type_const*>
              ((locator *)&local_130,local_178,uVar18,&local_180);
  }
LAB_003f5a87:
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (Type *)pbVar14[1]._M_len;
  uVar18 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar15 = uVar18 >> ((byte)(local_168->typesToDisambiguate).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                            .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar18 & 0xff];
  uVar17 = (local_168->typesToDisambiguate).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
           .arrays.groups_size_mask;
  uVar19 = 0;
  uVar13 = uVar15;
  do {
    pgVar1 = (local_168->typesToDisambiguate).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
             .arrays.groups_ + uVar13;
    local_108 = pgVar1->m[0].n;
    uStack_107 = pgVar1->m[1].n;
    uStack_106 = pgVar1->m[2].n;
    bStack_105 = pgVar1->m[3].n;
    uStack_104 = pgVar1->m[4].n;
    uStack_103 = pgVar1->m[5].n;
    uStack_102 = pgVar1->m[6].n;
    bStack_101 = pgVar1->m[7].n;
    uStack_100 = pgVar1->m[8].n;
    uStack_ff = pgVar1->m[9].n;
    uStack_fe = pgVar1->m[10].n;
    bStack_fd = pgVar1->m[0xb].n;
    uStack_fc = pgVar1->m[0xc].n;
    uStack_fb = pgVar1->m[0xd].n;
    uStack_fa = pgVar1->m[0xe].n;
    bStack_f9 = pgVar1->m[0xf].n;
    uVar22 = (uchar)uVar3;
    auVar29[0] = -(local_108 == uVar22);
    uVar24 = (uchar)((uint)uVar3 >> 8);
    auVar29[1] = -(uStack_107 == uVar24);
    uVar25 = (uchar)((uint)uVar3 >> 0x10);
    auVar29[2] = -(uStack_106 == uVar25);
    bVar26 = (byte)((uint)uVar3 >> 0x18);
    auVar29[3] = -(bStack_105 == bVar26);
    auVar29[4] = -(uStack_104 == uVar22);
    auVar29[5] = -(uStack_103 == uVar24);
    auVar29[6] = -(uStack_102 == uVar25);
    auVar29[7] = -(bStack_101 == bVar26);
    auVar29[8] = -(uStack_100 == uVar22);
    auVar29[9] = -(uStack_ff == uVar24);
    auVar29[10] = -(uStack_fe == uVar25);
    auVar29[0xb] = -(bStack_fd == bVar26);
    auVar29[0xc] = -(uStack_fc == uVar22);
    auVar29[0xd] = -(uStack_fb == uVar24);
    auVar29[0xe] = -(uStack_fa == uVar25);
    auVar29[0xf] = -(bStack_f9 == bVar26);
    for (uVar11 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe); uVar11 != 0;
        uVar11 = uVar11 - 1 & uVar11) {
      uVar5 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      pvVar20 = local_170;
      if ((Type *)pbVar14[1]._M_len ==
          (local_168->typesToDisambiguate).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
          .arrays.elements_[uVar13 * 0xf + (ulong)uVar5]) goto LAB_003f5b82;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar18 & 7] & bStack_f9) == 0) break;
    lVar16 = uVar13 + uVar19;
    uVar19 = uVar19 + 1;
    uVar13 = lVar16 + 1U & uVar17;
  } while (uVar19 <= uVar17);
  if ((local_168->typesToDisambiguate).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
      .size_ctrl.size <
      (local_168->typesToDisambiguate).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
    ::unchecked_emplace_at<slang::ast::Type_const*const&>
              ((locator *)&local_130,local_178,uVar15,uVar18,(Type **)(pbVar14 + 1));
    pvVar20 = local_170;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
    ::unchecked_emplace_with_rehash<slang::ast::Type_const*const&>
              ((locator *)&local_130,local_178,uVar18,(Type **)(pbVar14 + 1));
    pvVar20 = local_170;
  }
LAB_003f5b82:
  pvVar21 = pvVar21 + 1;
  goto LAB_003f57bc;
}

Assistant:

void TypeArgFormatter::startMessage(const Diagnostic& diag) {
    seenTypes.clear();
    typesToDisambiguate.clear();

    SmallMap<std::string_view, const Type*, 4> typeNames;
    for (auto& arg : diag.args) {
        if (auto customArg = std::get_if<Diagnostic::CustomArgType>(&arg)) {
            if (auto typePtr = std::any_cast<const Type*>(&customArg->second)) {
                auto& type = **typePtr;
                if (type.isAlias()) {
                    auto [it, inserted] = typeNames.emplace(type.name, &type);
                    if (!inserted) {
                        typesToDisambiguate.insert(&type);
                        typesToDisambiguate.insert(it->second);
                    }
                }
            }
        }
    }
}